

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

void __thiscall crnlib::qdxt1::~qdxt1(qdxt1 *this)

{
  long lVar1;
  
  spinlock::~spinlock(&this->m_cluster_hash_lock);
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  ::~hash_map(&this->m_cluster_hash);
  lVar1 = 0x18d0;
  do {
    vector<crnlib::vector<unsigned_int>_>::~vector
              ((vector<crnlib::vector<unsigned_int>_> *)
               ((long)(this->m_params).m_mip_desc + lVar1 + -0x4c));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0x8d0);
  threaded_clusterizer<crnlib::vec<16U,_float>_>::~threaded_clusterizer
            (&this->m_selector_clusterizer);
  vector<crnlib::vector<unsigned_int>_>::~vector(&this->m_endpoint_cluster_indices);
  clusterizer<crnlib::vec<6U,_float>_>::~clusterizer(&this->m_endpoint_clusterizer);
  return;
}

Assistant:

qdxt1::~qdxt1()
    {
    }